

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_fp16.h
# Opt level: O0

void ncnn::cast_fp16_to_fp32_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 *puVar2;
  long *in_RSI;
  long *in_RDI;
  float fVar3;
  undefined1 auVar4 [16];
  __m128 _v_fp32_1;
  __m128i _v_fp16_1;
  __m256 _v_fp32;
  __m128i _v_fp16;
  int i;
  float *outptr;
  unsigned_short *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  int local_354;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined4 local_338;
  long local_330;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined8 local_310;
  float *local_308;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined4 local_2d8;
  long local_2d0;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined8 local_2b0;
  undefined1 (*local_2a8) [16];
  int local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  long *local_278;
  long *local_270;
  undefined1 local_265;
  int local_264;
  undefined8 *local_258;
  undefined8 *local_248;
  undefined8 *local_238;
  undefined1 local_225;
  int local_224;
  undefined8 *local_218;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  float *local_1f0;
  undefined4 local_1e4;
  int local_1e0;
  int local_1dc;
  undefined8 *local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  long local_1c0;
  undefined1 (*local_1b8) [16];
  undefined4 local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 *local_1a0;
  undefined4 local_194;
  long local_190;
  undefined4 local_184;
  long local_180;
  undefined8 *local_150;
  undefined8 *local_130;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined1 (*local_d8) [16];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  float *local_88;
  ulong local_80;
  undefined8 uStack_78;
  undefined1 (*local_68) [16];
  ulong local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  float *local_38;
  
  local_284 = *(int *)((long)in_RDI + 0x2c);
  local_288 = (int)in_RDI[6];
  local_28c = *(int *)((long)in_RDI + 0x34);
  local_290 = (int)in_RDI[7];
  local_294 = (int)in_RDI[3];
  local_298 = local_284 * local_288 * local_28c * local_294;
  local_278 = in_RSI;
  local_270 = in_RDI;
  for (local_29c = 0; local_29c < local_290; local_29c = local_29c + 1) {
    local_258 = &local_2f0;
    local_1a4 = *(int *)((long)local_270 + 0x2c);
    local_1a8 = (int)local_270[6];
    local_1ac = *(undefined4 *)((long)local_270 + 0x34);
    local_1b8 = (undefined1 (*) [16])(*local_270 + local_270[8] * (long)local_29c * local_270[2]);
    local_1c0 = local_270[2];
    local_1c4 = (undefined4)local_270[3];
    local_1d0 = local_270[4];
    local_1a0 = &local_2f0;
    local_190 = (long)local_1a4 * (long)local_1a8 * local_1c0;
    local_e8 = &local_2f0;
    local_248 = &local_2f0;
    local_218 = &local_350;
    local_1dc = *(int *)((long)local_278 + 0x2c);
    local_1e0 = (int)local_278[6];
    local_1e4 = *(undefined4 *)((long)local_278 + 0x34);
    local_1f0 = (float *)(*local_278 + local_278[8] * (long)local_29c * local_278[2]);
    local_1f8 = local_278[2];
    local_1fc = (undefined4)local_278[3];
    local_208 = local_278[4];
    local_1d8 = &local_350;
    local_180 = (long)local_1dc * (long)local_1e0 * local_1f8;
    local_e0 = &local_350;
    local_238 = &local_350;
    local_2b8 = 0;
    local_2bc = 0;
    local_2c0 = 0;
    local_2c4 = 0;
    local_2d8 = 0;
    local_2e0 = 0;
    local_2e8 = 0;
    local_2f0 = 0;
    local_184 = 0x10;
    local_194 = 0x10;
    local_224 = local_29c;
    local_225 = 1;
    local_264 = local_29c;
    local_265 = 1;
    local_2b0 = 0;
    local_2c8 = 0;
    local_350 = 0;
    local_340 = 0;
    local_338 = 0;
    local_328 = 0;
    local_324 = 0;
    local_320 = 0;
    local_31c = 0;
    local_318 = 0;
    local_310 = 0;
    local_348 = 0;
    local_308 = local_1f0;
    local_2a8 = local_1b8;
    for (local_354 = 0; local_354 + 7 < local_298; local_354 = local_354 + 8) {
      local_d8 = local_2a8;
      local_d0 = *(undefined8 *)*local_2a8;
      uStack_c8 = *(undefined8 *)(*local_2a8 + 8);
      auVar1 = vcvtph2ps_f16c(*local_2a8);
      local_88 = local_308;
      local_3a0 = auVar1._0_8_;
      local_c0 = local_3a0;
      uStack_398 = auVar1._8_8_;
      uStack_b8 = uStack_398;
      uStack_390 = auVar1._16_8_;
      uStack_b0 = uStack_390;
      uStack_388 = auVar1._24_8_;
      uStack_a8 = uStack_388;
      *(undefined8 *)local_308 = local_3a0;
      *(undefined8 *)(local_308 + 2) = uStack_398;
      *(undefined8 *)(local_308 + 4) = uStack_390;
      *(undefined8 *)(local_308 + 6) = uStack_388;
      local_2a8 = local_2a8 + 1;
      local_308 = local_308 + 8;
    }
    for (; local_150 = local_238, local_130 = local_248, local_330 = local_208,
        local_2d0 = local_1d0, local_354 + 3 < local_298; local_354 = local_354 + 4) {
      local_68 = local_2a8;
      local_80 = *(ulong *)*local_2a8;
      uStack_78 = 0;
      uStack_58 = 0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_80;
      auVar4 = vcvtph2ps_f16c(auVar4);
      local_38 = local_308;
      local_3c0 = auVar4._0_8_;
      local_50 = local_3c0;
      uStack_3b8 = auVar4._8_8_;
      uStack_48 = uStack_3b8;
      *(undefined8 *)local_308 = local_3c0;
      *(undefined8 *)(local_308 + 2) = uStack_3b8;
      local_2a8 = (undefined1 (*) [16])(*local_2a8 + 8);
      local_308 = local_308 + 4;
      local_60 = local_80;
    }
    for (; local_354 < local_298; local_354 = local_354 + 1) {
      puVar2 = *local_2a8;
      local_2a8 = (undefined1 (*) [16])(*local_2a8 + 2);
      fVar3 = float16_to_float32(*(unsigned_short *)puVar2);
      *local_308 = fVar3;
      local_308 = local_308 + 1;
    }
  }
  return;
}

Assistant:

static void cast_fp16_to_fp32_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        cast_fp16_to_fp32_sse_f16c(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const unsigned short* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        int i = 0;
#if __F16C__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m256i _v_fp16 = _mm256_loadu_si256((const __m256i*)ptr);
            __m512 _v_fp32 = _mm512_cvtph_ps(_v_fp16);
            _mm512_storeu_ps(outptr, _v_fp32);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m128i _v_fp16 = _mm_loadu_si128((const __m128i*)ptr);
            __m256 _v_fp32 = _mm256_cvtph_ps(_v_fp16);
            _mm256_storeu_ps(outptr, _v_fp32);
            ptr += 8;
            outptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128i _v_fp16 = _mm_loadl_epi64((const __m128i*)ptr);
            __m128 _v_fp32 = _mm_cvtph_ps(_v_fp16);
            _mm_storeu_ps(outptr, _v_fp32);
            ptr += 4;
            outptr += 4;
        }
#endif // __F16C__
        for (; i < size; i++)
        {
            *outptr++ = float16_to_float32(*ptr++);
        }
    }
}